

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O1

void PrintExtraInfoLossless(WebPPicture *pic,int short_output,char *file_name)

{
  if (short_output == 0) {
    PrintExtraInfoLossless_cold_1();
    return;
  }
  fprintf(stderr,"%7d %2.2f\n",(double)pic->stats->PSNR[3],(ulong)(uint)pic->stats->coded_size);
  return;
}

Assistant:

static void PrintExtraInfoLossless(const WebPPicture* const pic,
                                   int short_output,
                                   const char* const file_name) {
  const WebPAuxStats* const stats = pic->stats;
  if (short_output) {
    fprintf(stderr, "%7d %2.2f\n", stats->coded_size, stats->PSNR[3]);
  } else {
    WFPRINTF(stderr, "File:      %s\n", (const W_CHAR*)file_name);
    fprintf(stderr, "Dimension: %d x %d\n", pic->width, pic->height);
    fprintf(stderr, "Output:    %d bytes (%.2f bpp)\n", stats->coded_size,
            8.f * stats->coded_size / pic->width / pic->height);
    PrintFullLosslessInfo(stats, "ARGB");
  }
}